

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
wasm::TopologicalSort::minSort<std::less<unsigned_int>>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          TopologicalSort *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  TopologicalOrdersImpl<std::less<unsigned_int>_> local_90;
  TopologicalSort *local_20;
  Graph *graph_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_10;
  
  local_20 = this;
  local_10 = __return_storage_ptr__;
  TopologicalOrdersImpl<std::less<unsigned_int>_>::TopologicalOrdersImpl(&local_90,this);
  __x = TopologicalOrdersImpl<std::less<unsigned_int>_>::operator*(&local_90);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__,__x);
  TopologicalOrdersImpl<std::less<unsigned_int>_>::~TopologicalOrdersImpl(&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Index> minSort(const Graph& graph, Cmp cmp) {
  return *TopologicalOrdersImpl<Cmp>(graph, cmp);
}